

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O0

int __thiscall lsvm::hashset::remove(hashset *this,char *__filename)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  hash hVar5;
  hashbucket **pphVar6;
  entry *peVar7;
  void *val_3;
  entry *ehe_1;
  void *val_2;
  void *val_1;
  entry *ehe;
  uint32_t bs;
  entry *he;
  uint32_t index;
  uint32_t range;
  hashbucket *bp;
  uint16_t bit;
  hash keyhash;
  uint32_t in_stack_ffffffffffffff8c;
  hashset *in_stack_ffffffffffffff90;
  entry *local_40;
  uint local_34;
  hashbucket *local_30;
  
  hVar5 = (*this->hash)(__filename);
  pphVar6 = partition(in_stack_ffffffffffffff90,(uint16_t)(in_stack_ffffffffffffff8c >> 0x10));
  local_30 = *pphVar6;
  do {
    if (local_30 == (hashbucket *)0x0) {
      return 0;
    }
    local_34 = ((uint)this->range * *(int *)(primes + (ulong)local_30->bucket_size_indx * 4)) /
               100000;
    iVar4 = (int)(hVar5 % (ulong)*(uint *)(primes + (ulong)local_30->bucket_size_indx * 4));
    local_40 = get_entry((hashbucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    uVar1 = *(uint *)(primes + (ulong)local_30->bucket_size_indx * 4);
    if (uVar1 <= local_34) {
      local_34 = uVar1 - 1;
    }
    if (iVar4 + local_34 < uVar1) {
      peVar7 = local_40 + local_34;
      for (; local_40 <= peVar7; local_40 = local_40 + 1) {
        if (((local_40->valhash == hVar5) && (local_40->val != (void *)0x0)) &&
           (bVar3 = (*this->equals)(__filename,local_40->val), bVar3)) {
          iVar4 = (int)local_40->val;
          clear_entry(this,local_30,local_40);
          return iVar4;
        }
      }
    }
    else {
      peVar7 = get_entry((hashbucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      for (; local_40 <= peVar7; local_40 = local_40 + 1) {
        if (((local_40->valhash == hVar5) && (local_40->val != (void *)0x0)) &&
           (bVar3 = (*this->equals)(__filename,local_40->val), bVar3)) {
          pvVar2 = local_40->val;
          clear_entry(this,local_30,local_40);
          return (int)pvVar2;
        }
      }
      local_40 = get_entry((hashbucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      peVar7 = local_40 + ((iVar4 + local_34) - uVar1);
      for (; local_40 <= peVar7; local_40 = local_40 + 1) {
        if (((local_40->valhash == hVar5) && (local_40->val != (void *)0x0)) &&
           (bVar3 = (*this->equals)(__filename,local_40->val), bVar3)) {
          pvVar2 = local_40->val;
          clear_entry(this,local_30,local_40);
          return (int)pvVar2;
        }
      }
    }
    local_30 = local_30->next;
  } while( true );
}

Assistant:

void* remove(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *(partition(h,bit));

    // find key in a bucket using open address
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    void* val = he->val;
                    clear_entry(h,bp,he);
                    return val;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    return null;
}